

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NegaMaxSearch.h
# Opt level: O2

int negamax(int alpha,int beta,int depth)

{
  uint uVar1;
  bool bVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  unsigned_long_long uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  moves *pmVar20;
  ulong uVar21;
  unsigned_long_long *puVar22;
  unsigned_long_long *puVar23;
  int *piVar24;
  ulong uVar25;
  byte bVar26;
  uint local_50c;
  int local_500;
  int local_4e4;
  int local_4dc;
  unsigned_long_long occupanciesCopy_1 [3];
  unsigned_long_long occupanciesCopy [3];
  moves moveList [1];
  
  iVar8 = ply;
  bVar26 = 0;
  lVar19 = (long)ply;
  pvLength[lVar19] = ply;
  if (lVar19 == 0) {
    if (99 < fiftyRuleCounter) {
      return 0;
    }
    bVar2 = 1 < beta - alpha;
    uVar1 = 0;
    goto LAB_001069c6;
  }
  uVar16 = 0;
  if (0 < repetitionIndex) {
    uVar16 = (ulong)(uint)repetitionIndex;
  }
  uVar21 = 0xffffffffffffffff;
  do {
    uVar25 = uVar16;
    if (uVar21 - uVar16 == -1) break;
    uVar25 = uVar21 + 1;
    lVar19 = uVar21 + 1;
    uVar21 = uVar25;
  } while (repetitionTable[lVar19] != hashKey);
  if ((long)uVar25 < (long)repetitionIndex) {
    return 0;
  }
  if (99 < fiftyRuleCounter) {
    return 0;
  }
  bVar2 = 1 < beta - alpha;
  uVar1 = 0;
  uVar16 = hashKey % (ulong)(long)hashEntries;
  if (hashTable[uVar16].hashKey != hashKey) goto LAB_001069c6;
  if (hashTable[uVar16].depth < depth) goto LAB_001069bd;
  uVar1 = 0;
  iVar9 = 0;
  if (hashTable[uVar16].score < -48000) {
    iVar9 = iVar8;
  }
  iVar11 = hashTable[uVar16].flag;
  iVar9 = iVar9 + hashTable[uVar16].score;
  iVar18 = 0;
  if (48000 < iVar9) {
    iVar18 = iVar8;
  }
  iVar9 = iVar9 - iVar18;
  iVar8 = iVar9;
  if (iVar11 == 0) {
LAB_00106ce2:
    if (iVar8 != 100000 && beta - alpha < 2) {
      return iVar8;
    }
  }
  else {
    if (iVar11 == 1) {
      iVar8 = alpha;
      if (iVar9 <= alpha) goto LAB_00106ce2;
    }
    else if ((iVar11 == 2) && (iVar8 = beta, beta <= iVar9)) goto LAB_00106ce2;
LAB_001069bd:
    uVar1 = hashTable[uVar16].bestMove;
  }
LAB_001069c6:
  if ((nodes & 0x7ff) == 0) {
    communicate();
  }
  iVar8 = side;
  if (depth == 0) {
    iVar8 = quietSearch(alpha,beta);
    return iVar8;
  }
  if (0x3f < ply) {
    iVar8 = evaluate();
    return iVar8;
  }
  nodes = nodes + 1;
  lVar19 = 0x58;
  if (side == 0) {
    lVar19 = 0x28;
  }
  iVar9 = getLSBIndex(*(unsigned_long_long *)((long)bitboardsPieces + lVar19));
  uVar10 = isSquareAttacked(iVar9,iVar8 ^ 1);
  iVar18 = uVar10 + depth;
  iVar11 = evaluate();
  uVar3 = hashKey;
  iVar9 = enpassant;
  iVar8 = side;
  if ((((uVar10 & 1) == 0 && !bVar2) && iVar18 < 3) &&
     (iVar11 = iVar11 + depth * -0x78, beta <= iVar11)) {
    return iVar11;
  }
  if ((ply != 0 && uVar10 == 0) && 2 < iVar18) {
    puVar22 = bitboardsPieces;
    pmVar20 = moveList;
    for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
      *(unsigned_long_long *)pmVar20->moves = *puVar22;
      puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
      pmVar20 = (moves *)((long)pmVar20 + (ulong)bVar26 * -0x10 + 8);
    }
    occupanciesCopy[2] = occupancies[2];
    occupanciesCopy[0] = occupancies[0];
    occupanciesCopy[1] = occupancies[1];
    ply = ply + 1;
    lVar19 = (long)repetitionIndex;
    repetitionIndex = repetitionIndex + 1;
    repetitionTable[lVar19 + 1] = hashKey;
    iVar7 = fiftyRuleCounter;
    iVar11 = castle;
    if ((long)enpassant != 0x40) {
      hashKey = enpassantKeys[enpassant] ^ hashKey;
    }
    enpassant = 0x40;
    side = side ^ 1;
    hashKey = hashKey ^ sideKey;
    iVar12 = negamax(-beta,1 - beta,depth + -3);
    ply = ply + -1;
    repetitionIndex = repetitionIndex + -1;
    pmVar20 = moveList;
    puVar22 = bitboardsPieces;
    for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
      *puVar22 = *(unsigned_long_long *)pmVar20->moves;
      pmVar20 = (moves *)((long)pmVar20 + (ulong)bVar26 * -0x10 + 8);
      puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
    }
    occupancies[2] = occupanciesCopy[2];
    occupancies[0] = occupanciesCopy[0];
    occupancies[1] = occupanciesCopy[1];
    if (isStopped == 1) {
      side = iVar8;
      enpassant = iVar9;
      castle = iVar11;
      hashKey = uVar3;
      fiftyRuleCounter = iVar7;
      return 0;
    }
    castle = iVar11;
    fiftyRuleCounter = iVar7;
    if (beta <= -iVar12) {
      side = iVar8;
      enpassant = iVar9;
      hashKey = uVar3;
      return beta;
    }
  }
  side = iVar8;
  enpassant = iVar9;
  hashKey = uVar3;
  if (iVar18 < 4 && (!bVar2 && (char)uVar10 == '\0')) {
    iVar9 = evaluate();
    iVar8 = iVar9 + 0x7d;
    if (iVar8 < beta) {
      if (depth == 1) {
        iVar9 = quietSearch(alpha,beta);
        if (iVar9 <= iVar8) {
          return iVar8;
        }
        return iVar9;
      }
      iVar9 = iVar9 + 300;
      if ((depth < 3 && iVar9 < beta) && (iVar8 = quietSearch(alpha,beta), iVar8 < beta)) {
        if (iVar9 < iVar8) {
          return iVar8;
        }
        return iVar9;
      }
    }
  }
  generateMoves(moveList);
  local_4e4 = 1;
  if (followPV != 0) {
    followPV = 0;
    uVar21 = 0;
    uVar16 = (ulong)(uint)moveList[0].count;
    if (moveList[0].count < 1) {
      uVar16 = uVar21;
    }
    for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
      if (pvTable[0][ply] == moveList[0].moves[uVar21]) {
        followPV = local_4e4;
        scorePV = local_4e4;
      }
    }
  }
  sortMoves(moveList,uVar1);
  lVar19 = 0;
  local_500 = 0;
  local_4dc = 0;
  local_50c = alpha;
  do {
    iVar7 = fiftyRuleCounter;
    uVar6 = hashKey;
    iVar11 = castle;
    iVar9 = enpassant;
    iVar8 = side;
    uVar5 = occupancies[2];
    uVar4 = occupancies[1];
    uVar3 = occupancies[0];
    if (moveList[0].count <= lVar19) {
      if (local_500 != 0) {
        writeHashEntry(local_50c,uVar1,iVar18,local_4e4);
        return local_50c;
      }
      if (uVar10 == 0) {
        return 0;
      }
      return ply + -49000;
    }
    puVar22 = bitboardsPieces;
    puVar23 = occupanciesCopy;
    for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar23 = *puVar22;
      puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
      puVar23 = puVar23 + (ulong)bVar26 * -2 + 1;
    }
    ply = ply + 1;
    lVar14 = (long)repetitionIndex;
    repetitionIndex = repetitionIndex + 1;
    repetitionTable[lVar14 + 1] = hashKey;
    iVar12 = makeMove(moveList[0].moves[lVar19],0);
    if (iVar12 == 0) {
      ply = ply + -1;
      repetitionIndex = repetitionIndex + -1;
    }
    else {
      if (local_4dc == 0) {
LAB_00106f50:
        iVar12 = negamax(-beta,-local_50c,iVar18 + -1);
        uVar13 = -iVar12;
      }
      else if ((local_4dc < 4 || (iVar18 < 3 || uVar10 != 0)) ||
              ((*(byte *)((long)moveList[0].moves + lVar19 * 4 + 2) & 0x1f) != 0)) {
LAB_00106f11:
        iVar12 = negamax(~local_50c,-local_50c,iVar18 + -1);
        uVar13 = -iVar12;
        if ((int)uVar13 < beta && SBORROW4(local_50c,uVar13) != (int)(local_50c + iVar12) < 0)
        goto LAB_00106f50;
      }
      else {
        iVar12 = negamax(~local_50c,-local_50c,depth + -2);
        uVar13 = -iVar12;
        if (SBORROW4(local_50c,uVar13) != (int)(local_50c + iVar12) < 0) goto LAB_00106f11;
      }
      lVar17 = (long)ply;
      iVar12 = ply + -1;
      repetitionIndex = repetitionIndex + -1;
      puVar22 = occupanciesCopy;
      puVar23 = bitboardsPieces;
      ply = iVar12;
      for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar23 = *puVar22;
        puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
        puVar23 = puVar23 + (ulong)bVar26 * -2 + 1;
      }
      if (isStopped == 1) {
        occupancies[0] = uVar3;
        occupancies[1] = uVar4;
        occupancies[2] = uVar5;
        side = iVar8;
        enpassant = iVar9;
        castle = iVar11;
        hashKey = uVar6;
        fiftyRuleCounter = iVar7;
        return 0;
      }
      local_500 = local_500 + 1;
      local_4dc = local_4dc + 1;
      occupancies[0] = uVar3;
      occupancies[1] = uVar4;
      occupancies[2] = uVar5;
      side = iVar8;
      enpassant = iVar9;
      castle = iVar11;
      hashKey = uVar6;
      fiftyRuleCounter = iVar7;
      if ((int)local_50c < (int)uVar13) {
        uVar1 = moveList[0].moves[lVar19];
        if ((uVar1 >> 0x14 & 1) == 0) {
          piVar24 = (int *)((long)historyMoves[0] +
                           (ulong)(uVar1 >> 4 & 0xfc) + (ulong)(uVar1 >> 4 & 0xf00));
          *piVar24 = *piVar24 + iVar18;
        }
        lVar15 = (long)iVar12;
        *(uint *)((long)pvTable + lVar15 * 0x104) = uVar1;
        iVar8 = pvLength[lVar17];
        piVar24 = (int *)((long)pvTable + lVar15 * 0x104 + 4);
        lVar14 = lVar15;
        while (lVar14 + 1 < (long)iVar8) {
          *piVar24 = pvTable[lVar17][lVar14 + 1];
          piVar24 = piVar24 + 1;
          lVar14 = lVar14 + 1;
        }
        pvLength[lVar15] = iVar8;
        local_4e4 = 0;
        local_50c = uVar13;
        if (beta <= (int)uVar13) {
          writeHashEntry(beta,uVar1,iVar18,2);
          uVar1 = moveList[0].moves[lVar19];
          if ((uVar1 >> 0x14 & 1) == 0) {
            lVar19 = (long)ply;
            killerMoves[1][lVar19] = killerMoves[0][lVar19];
            killerMoves[0][lVar19] = uVar1;
            return beta;
          }
          return beta;
        }
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

static inline int negamax(int alpha, int beta, int depth) {
    // initializing length of current variation
    pvLength[ply] = ply;

    int score;

    int bestMove = 0;

    int hashFlag = ALPHA;

    if ((ply && isRepetition()) || fiftyRuleCounter >= 100) {
        // if repetition is found \ 50 move rule found -> return draw value
        return 0;
    }


    // checking if current node is PV or not
    int pvNode = beta - alpha > 1;


    if (ply && (score = readHashEntry(alpha, beta, &bestMove, depth)) != NO_HASH_FOUND && pvNode == 0) {
        // if search deep is bigger than 0 AND hash entry was found, AND current node is not a PV node -> return score found in entry
        return score;
    }


    if ((nodes & 2047) == 0) {
        // check for GUI/user input
        communicate();
    }


    if (depth == 0) {

        // no more depth to search in negamax, go to quiet search(escape condition)
        return quietSearch(alpha, beta);
    }


    if (ply > MAX_PLY - 1) {
        // in case we are to deep in the search -> return evaluation of the board
        return evaluate();
    }

    nodes++;

    // checking for checks
    int isInCheck = isSquareAttacked((side == WHITE) ? getLSBIndex(bitboardsPieces[K]) : getLSBIndex(bitboardsPieces[k]),
                                     side ^ 1);


    if (isInCheck) {
        // if in check -> scan deeper
        depth++;
    }


    int legalMoves = 0;



    // evaluation pruning / static null move pruning
    int staticEval = evaluate();
    if (depth < 3 && !pvNode && !isInCheck && abs(beta - 1) > -INFINITY + 100) {
        int evalMargin = 120 * depth;
        if (staticEval - evalMargin >= beta) {
            return staticEval - evalMargin;
        }

    }

    // null move pruning -> making another move from oppononet before continue evaluating to prune more moves
    if (depth >= 3 && isInCheck == 0 && ply) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;

        // switch sides and fix hashing for switching sides
        if (enpassant != NO_SQUARE)
            hashKey ^= enpassantKeys[enpassant];
        enpassant = NO_SQUARE;

        side ^= 1;
        hashKey ^= sideKey;

        // searching with smaller depth, with considiration on limit reduction
        score = -negamax(-beta, -beta + 1, depth - 1 - 2);


        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // flag to stop, quit searching
            return 0;
        }

        if (score >= beta) {
            // node (position) fails high
            return beta;
        }

    }

    // razoring
    if (!pvNode && !isInCheck && depth <= 3) {
        // get static eval and add first bonus
        score = evaluate() + 125;

        // define new score
        int newScore;

        // static evaluation indicates a fail-low node
        if (score < beta) {
            // on depth 1
            if (depth == 1) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // return quiescence score if it's greater then static evaluation score
                return (newScore > score) ? newScore : score;
            }

            // add second bonus to static evaluation
            score += 175;

            // static evaluation indicates a fail-low node
            if (score < beta && depth <= 2) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // quiescence score indicates fail-low node
                if (newScore < beta)
                    // return quiescence score if it's greater then static evaluation score
                    return (newScore > score) ? newScore : score;
            }
        }
    }


    moves moveList[1];
    generateMoves(moveList);


    if (followPV) {
        //following Principal variation Line(PV) ->  enable PV move scoring
        enablePvScoring(moveList);
    }

    sortMoves(moveList, bestMove);

    // number of moves searched in a move list
    int movesSearched = 0;


    for (int count = 0; count < moveList->count; count++) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;


        if (makeMove(moveList->moves[count], ALL_MOVES) == 0) {
            // if invalid move -> go back to another move
            ply--;
            repetitionIndex--;
            continue;
        }

        legalMoves++;


        if (movesSearched == 0) {
            // no search occured yet -> search normally
            score = -negamax(-beta, -alpha, depth - 1);
        }
            // Late Move Reduction
        else {
            // condition to consider LMR
            if (
                    movesSearched >= fullDepthMoves &&
                    depth >= reductionLimit &&
                    isInCheck == 0 &&
                    getMoveCapture(moveList->moves[count]) == 0 &&
                    getMovePromoted(moveList->moves[count]) == 0)
                // search current move with reduced depth:
                score = -negamax(-alpha - 1, -alpha, depth - 2);

                // ensure full depth is going to be done
            else
                score = alpha + 1;

            // principle variation search PVS
            if (score > alpha) {
                //Focusing on Principal Variation
                score = -negamax(-alpha - 1, -alpha, depth - 1);

                // If Reduction was wrong -> try and fixed it with search with more depth and normal alpha beta score bounds
                if ((score > alpha) && (score < beta)) {
                    score = -negamax(-beta, -alpha, depth - 1);
                }

            }
        }

        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // Stop search due to signal by user \ GUI
            return 0;
        }


        movesSearched++;


        if (score > alpha) {
            // found a better move -> mark this move as Principal variation Node
            hashFlag = PV;

            bestMove = moveList->moves[count];

            if (getMoveCapture(moveList->moves[count]) == 0) {
                // if not a capture -> store as history move
                historyMoves[getMovePiece(moveList->moves[count])][getMoveTarget(
                        moveList->moves[count])] += depth;

            }

            // PV node (position), writing it to PV table
            alpha = score;
            pvTable[ply][ply] = moveList->moves[count];
            for (int nextPly = ply + 1; nextPly < pvLength[ply + 1]; nextPly++) {
                // copy move from deeper ply into a current ply's line
                pvTable[ply][nextPly] = pvTable[ply + 1][nextPly];
            }
            pvLength[ply] = pvLength[ply + 1];


            if (score >= beta) {
                // storing move as beta
                writeHashEntry(beta, bestMove, depth, BETA);


                if (getMoveCapture(moveList->moves[count]) == 0) {
                    // on quiet moves -> store killer moves
                    killerMoves[1][ply] = killerMoves[0][ply];
                    killerMoves[0][ply] = moveList->moves[count];
                }

                // node (position) fails high
                return beta;
            }
        }
    }


    if (legalMoves == 0) {
        // we don't have any legal moves to make in the current postion -> check for mate or stalmate
        if (isInCheck) {
            // Mate: returning MATE_VALUE + ply to consider fast mate first
            return -MATE_VALUE + ply;
        } else {
            // StalMate ->  return draw score
            return 0;
        }

    }

    // store hash entry with the score equal to alpha
    writeHashEntry(alpha, bestMove, depth, hashFlag);

    // return fail low score
    return alpha;
}